

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxToken.cpp
# Opt level: O0

bool __thiscall psy::C::SyntaxToken::isComment(SyntaxToken *this)

{
  bool local_11;
  SyntaxToken *this_local;
  
  local_11 = true;
  if ((((this->syntaxK_ != MultiLineCommentTrivia) &&
       (local_11 = true, this->syntaxK_ != MultiLineDocumentationCommentTrivia)) &&
      (local_11 = true, this->syntaxK_ != SingleLineCommentTrivia)) &&
     (local_11 = true, this->syntaxK_ != SingleLineDocumentationCommentTrivia)) {
    local_11 = this->syntaxK_ == Keyword_ExtPSY_omission;
  }
  return local_11;
}

Assistant:

bool SyntaxToken::isComment() const
{
    return syntaxK_ == SyntaxKind::MultiLineCommentTrivia
            || syntaxK_ == SyntaxKind::MultiLineDocumentationCommentTrivia
            || syntaxK_ == SyntaxKind::SingleLineCommentTrivia
            || syntaxK_ == SyntaxKind::SingleLineDocumentationCommentTrivia
            || syntaxK_ == SyntaxKind::Keyword_ExtPSY_omission;
}